

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_modifier_suite.cpp
# Opt level: O0

void swap_suite::swap_boolean(void)

{
  undefined1 *puVar1;
  bool bVar2;
  type tVar3;
  type_conflict4 tVar4;
  char *pcVar5;
  type_conflict9 tVar6;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b70;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b50;
  basic_variable<std::allocator<char>_> *local_b38;
  basic_variable<std::allocator<char>_> *local_b18;
  iterator local_a90;
  iterator local_a78;
  iterator local_a60;
  iterator local_a48;
  double local_a30;
  int local_a28;
  bool local_a21;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_a20;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a18;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_9b8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_958;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_8f8;
  undefined1 local_898 [24];
  variable expect_1;
  double local_850;
  int local_848;
  bool local_841;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_840;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_838;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_7d8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_778;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_718;
  undefined1 local_6b8 [24];
  variable other_9;
  variable data_9;
  iterator local_640;
  iterator local_628;
  iterator local_610;
  iterator local_5f8;
  basic_variable<std::allocator<char>_> *local_5e0;
  basic_variable<std::allocator<char>_> local_5d8;
  basic_variable<std::allocator<char>_> local_5a8;
  basic_variable<std::allocator<char>_> local_578;
  basic_variable<std::allocator<char>_> local_548;
  undefined1 local_518 [24];
  variable expect;
  basic_variable<std::allocator<char>_> local_4c8;
  basic_variable<std::allocator<char>_> local_498;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_408 [24];
  variable other_8;
  variable data_8;
  undefined1 local_378 [8];
  variable other_7;
  variable data_7;
  undefined1 local_2f8 [8];
  variable other_6;
  variable data_6;
  undefined1 local_278 [8];
  variable other_5;
  variable data_5;
  undefined1 local_1f8 [8];
  variable other_4;
  variable data_4;
  variable other_3;
  variable data_3;
  variable other_2;
  variable data_2;
  variable other_1;
  variable data_1;
  undefined1 local_68 [8];
  variable other;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  puVar1 = &other.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)local_68);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)puVar1);
  boost::detail::test_impl
            ("data.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x738,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_68);
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x739,"void swap_suite::swap_boolean()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_1.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&data_2.storage.field_0x28,false);
  puVar1 = &other_1.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)&data_2.storage.field_0x28);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)puVar1);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x741,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)&data_2.storage.field_0x28);
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x742,"void swap_suite::swap_boolean()",bVar2);
  tVar3 = trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)&other_1.storage.field_0x28);
  boost::detail::test_impl
            ("data.value<boolean>() == false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x743,"void swap_suite::swap_boolean()",(bool)(~tVar3 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_2.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&data_3.storage.field_0x28,2);
  puVar1 = &other_2.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)&data_3.storage.field_0x28);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>
                    ((basic_variable<std::allocator<char>_> *)puVar1);
  boost::detail::test_impl
            ("data.is<integer>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x74b,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)&data_3.storage.field_0x28);
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x74c,"void swap_suite::swap_boolean()",bVar2);
  tVar4 = trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::integer>
                    ((basic_variable<std::allocator<char>_> *)&other_2.storage.field_0x28);
  boost::detail::test_impl
            ("data.value<integer>() == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x74d,"void swap_suite::swap_boolean()",tVar4 == 2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_2.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_3.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)&data_4.storage.field_0x28,3.0);
  puVar1 = &other_3.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)&data_4.storage.field_0x28);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                    ((basic_variable<std::allocator<char>_> *)puVar1);
  boost::detail::test_impl
            ("data.is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x755,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)&data_4.storage.field_0x28);
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x756,"void swap_suite::swap_boolean()",bVar2);
  tVar6 = trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::real>
                    ((basic_variable<std::allocator<char>_> *)&other_3.storage.field_0x28);
  boost::detail::test_impl
            ("data.value<real>() == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x757,"void swap_suite::swap_boolean()",(bool)(-(tVar6 == 3.0) & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_3.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_4.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1f8,"alpha");
  puVar1 = &other_4.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)local_1f8);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                    ((basic_variable<std::allocator<char>_> *)puVar1);
  boost::detail::test_impl
            ("data.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x75f,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_1f8);
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x760,"void swap_suite::swap_boolean()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            ((type *)&data_5.storage.field_0x28,
             (basic_variable<std::allocator<char>_> *)&other_4.storage.field_0x28);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &data_5.storage.field_0x28,"alpha");
  boost::detail::test_impl
            ("data.value<string>() == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x761,"void swap_suite::swap_boolean()",bVar2);
  std::__cxx11::string::~string((string *)&data_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_4.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_5.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_278,L"bravo");
  puVar1 = &other_5.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)local_278);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                    ((basic_variable<std::allocator<char>_> *)puVar1);
  boost::detail::test_impl
            ("data.is<wstring>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x769,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_278);
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x76a,"void swap_suite::swap_boolean()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            ((type *)&data_6.storage.field_0x28,
             (basic_variable<std::allocator<char>> *)&other_5.storage.field_0x28);
  bVar2 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)&data_6.storage.field_0x28,L"bravo");
  boost::detail::test_impl
            ("data.value<std::wstring>() == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x76b,"void swap_suite::swap_boolean()",bVar2);
  std::__cxx11::wstring::~wstring((wstring *)&data_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_6.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2f8,L"charlie");
  puVar1 = &other_6.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)local_2f8);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                    ((basic_variable<std::allocator<char>_> *)puVar1);
  boost::detail::test_impl
            ("data.is<u16string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x773,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_2f8);
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x774,"void swap_suite::swap_boolean()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            ((type *)&data_7.storage.field_0x28,
             (basic_variable<std::allocator<char>> *)&other_6.storage.field_0x28);
  bVar2 = std::operator==((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                           *)&data_7.storage.field_0x28,L"charlie");
  boost::detail::test_impl
            ("data.value<std::u16string>() == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x775,"void swap_suite::swap_boolean()",bVar2);
  std::__cxx11::u16string::~u16string((u16string *)&data_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_7.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_378,L"delta");
  puVar1 = &other_7.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)local_378);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)puVar1);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x77d,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_378);
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x77e,"void swap_suite::swap_boolean()",bVar2);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            ((type *)&data_8.storage.field_0x28,
             (basic_variable<std::allocator<char>> *)&other_7.storage.field_0x28);
  bVar2 = std::operator==((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                           *)&data_8.storage.field_0x28,L"delta");
  boost::detail::test_impl
            ("data.value<std::u32string>() == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x77f,"void swap_suite::swap_boolean()",bVar2);
  std::__cxx11::u32string::~u32string((u32string *)&data_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_8.storage.field_0x28,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4c8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_498,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_468,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_438,"alpha");
  local_408._0_8_ = &local_4c8;
  local_408._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_408);
  local_b18 = (basic_variable<std::allocator<char>_> *)local_408;
  do {
    local_b18 = local_b18 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_b18);
  } while (local_b18 != &local_4c8);
  puVar1 = &other_8.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)(local_408 + 0x10));
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  boost::detail::test_impl
            ("data.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x787,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10));
  pcVar5 = "void swap_suite::swap_boolean()";
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x788,"void swap_suite::swap_boolean()",bVar2);
  local_5e0 = &local_5d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_5e0,true);
  local_5e0 = &local_5a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_5e0,2);
  local_5e0 = &local_578;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_5e0,3.0);
  local_5e0 = &local_548;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_5e0,"alpha");
  local_518._0_8_ = &local_5d8;
  local_518._8_8_ = 4;
  init._M_len = (size_type)pcVar5;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_518 + 0x10),
             (basic_array<std::allocator<char>_> *)local_518._0_8_,init);
  local_b38 = (basic_variable<std::allocator<char>_> *)local_518;
  do {
    local_b38 = local_b38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_b38);
  } while (local_b38 != &local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5f8,(basic_variable<std::allocator<char>_> *)&other_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_610,(basic_variable<std::allocator<char>_> *)&other_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_628,(basic_variable<std::allocator<char>_> *)(local_518 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_640,(basic_variable<std::allocator<char>_> *)(local_518 + 0x10));
  pcVar5 = "void swap_suite::swap_boolean()";
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x78d,"void swap_suite::swap_boolean()",&local_5f8,&local_610,&local_628,&local_640);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_640);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_610);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_518 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_8.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)&other_9.storage.field_0x28,true);
  local_840 = &local_838;
  local_841 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_840,(char (*) [6])"alpha",&local_841);
  local_840 = &local_7d8;
  local_848 = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_840,(char (*) [6])"bravo",&local_848);
  local_840 = &local_778;
  local_850 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>(local_840,(char (*) [8])"charlie",&local_850);
  local_840 = &local_718;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (local_840,(char (*) [6])"delta",(char (*) [10])"beryllium");
  local_6b8._0_8_ = &local_838;
  local_6b8._8_8_ = 4;
  init_00._M_len = (size_type)pcVar5;
  init_00._M_array = (iterator)0x4;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_6b8._0_8_,init_00);
  local_b50 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_6b8;
  do {
    local_b50 = local_b50 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_b50);
  } while (local_b50 != &local_838);
  puVar1 = &other_9.storage.field_0x28;
  trial::dynamic::basic_variable<std::allocator<char>_>::swap
            ((basic_variable<std::allocator<char>_> *)puVar1,
             (basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_map<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)puVar1);
  boost::detail::test_impl
            ("data.is<map>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x79b,"void swap_suite::swap_boolean()",bVar2);
  bVar2 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  pcVar5 = "void swap_suite::swap_boolean()";
  boost::detail::test_impl
            ("other.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x79c,"void swap_suite::swap_boolean()",bVar2);
  local_a20 = &local_a18;
  local_a21 = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_a20,(char (*) [6])"alpha",&local_a21);
  local_a20 = &local_9b8;
  local_a28 = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_a20,(char (*) [6])"bravo",&local_a28);
  local_a20 = &local_958;
  local_a30 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_double,_true>(local_a20,(char (*) [8])"charlie",&local_a30);
  local_a20 = &local_8f8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[10],_true>
            (local_a20,(char (*) [6])"delta",(char (*) [10])"beryllium");
  local_898._0_8_ = &local_a18;
  local_898._8_8_ = 4;
  init_01._M_len = (size_type)pcVar5;
  init_01._M_array = (iterator)0x4;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10),
             (basic_map<std::allocator<char>_> *)local_898._0_8_,init_01);
  local_b70 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_898;
  do {
    local_b70 = local_b70 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_b70);
  } while (local_b70 != &local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a48,(basic_variable<std::allocator<char>_> *)&other_9.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a60,(basic_variable<std::allocator<char>_> *)&other_9.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a78,(basic_variable<std::allocator<char>_> *)(local_898 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a90,(basic_variable<std::allocator<char>_> *)(local_898 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_modifier_suite.cpp"
             ,0x7a7,"void swap_suite::swap_boolean()",&local_a48,&local_a60,&local_a78,&local_a90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a90);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a60);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_898 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&other_9.storage.field_0x28);
  return;
}

Assistant:

void swap_boolean()
{
    // boolean - null
    {
        variable data(true);
        variable other;

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<nullable>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());
    }
    // boolean - boolean
    {
        variable data(true);
        variable other(false);

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());
        TRIAL_PROTOCOL_TEST(data.value<boolean>() == false);
    }
    // boolean - integer
    {
        variable data(true);
        variable other(2);

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<integer>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());
        TRIAL_PROTOCOL_TEST(data.value<integer>() == 2);
    }
    // boolean - real
    {
        variable data(true);
        variable other(3.0);

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<real>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());
        TRIAL_PROTOCOL_TEST(data.value<real>() == 3.0);
    }
    // boolean - string
    {
        variable data(true);
        variable other("alpha");

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<string>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());
        TRIAL_PROTOCOL_TEST(data.value<string>() == "alpha");
    }
    // boolean - wstring
    {
        variable data(true);
        variable other(L"bravo");

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<wstring>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());
        TRIAL_PROTOCOL_TEST(data.value<std::wstring>() == L"bravo");
    }
    // boolean - u16string
    {
        variable data(true);
        variable other(u"charlie");

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<u16string>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());
        TRIAL_PROTOCOL_TEST(data.value<std::u16string>() == u"charlie");
    }
    // boolean - u32string
    {
        variable data(true);
        variable other(U"delta");

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());
        TRIAL_PROTOCOL_TEST(data.value<std::u32string>() == U"delta");
    }
    // boolean - array
    {
        variable data(true);
        variable other = { true, 2, 3.0, "alpha" };

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<array>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());

        variable expect = array::make({ true, 2, 3.0, "alpha" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    // boolean - map
    {
        variable data(true);
        variable other = map::make(
            {
                { "alpha", true },
                { "bravo", 2 },
                { "charlie", 3.0 },
                { "delta", "beryllium" }
            });

        data.swap(other);
        TRIAL_PROTOCOL_TEST(data.is<map>());
        TRIAL_PROTOCOL_TEST(other.is<boolean>());

        variable expect = map::make(
            {
                { "alpha", true },
                { "bravo", 2 },
                { "charlie", 3.0 },
                { "delta", "beryllium" }
            });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}